

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

float vkt::sr::anon_unknown_0::MatrixCaseUtils::determinant<3>(Matrix<float,_3,_3> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (mat->m_data).m_data[1].m_data[1];
  fVar2 = (mat->m_data).m_data[0].m_data[0];
  fVar3 = (mat->m_data).m_data[0].m_data[1];
  fVar4 = (mat->m_data).m_data[1].m_data[0];
  fVar5 = (mat->m_data).m_data[2].m_data[1];
  fVar6 = (mat->m_data).m_data[2].m_data[0];
  fVar7 = (mat->m_data).m_data[2].m_data[2];
  fVar8 = (mat->m_data).m_data[0].m_data[2];
  fVar9 = (mat->m_data).m_data[1].m_data[2];
  return (((fVar6 * fVar3 * fVar9 + fVar2 * fVar1 * fVar7 + fVar4 * fVar5 * fVar8) -
          fVar5 * fVar2 * fVar9) - fVar3 * fVar4 * fVar7) - fVar1 * fVar6 * fVar8;
}

Assistant:

float determinant<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	return	+ mat(0,0) * mat(1,1) * mat(2,2)
			+ mat(0,1) * mat(1,2) * mat(2,0)
			+ mat(0,2) * mat(1,0) * mat(2,1)
			- mat(0,0) * mat(1,2) * mat(2,1)
			- mat(0,1) * mat(1,0) * mat(2,2)
			- mat(0,2) * mat(1,1) * mat(2,0);
}